

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

QPixmap * __thiscall
PixmapEntry::pixmap(QPixmap *__return_storage_ptr__,PixmapEntry *this,QSize *size,Mode mode,
                   State state,qreal scale)

{
  QPixmap *this_00;
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar1;
  bool bVar2;
  QPlatformPixmap *pQVar3;
  QSize QVar4;
  long lVar5;
  undefined4 uVar6;
  long in_FS_OFFSET;
  int iVar7;
  int iVar10;
  qreal scaleFactor;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar11;
  double dVar12;
  QString local_b8;
  QSize local_98;
  QPixmap local_90;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->basePixmap;
  bVar2 = QPixmap::isNull(this_00);
  if (bVar2) {
    QPixmap::load(this_00,&(this->super_QIconLoaderEngineEntry).filename,(char *)0x0,
                  (ImageConversionFlags)0x0);
  }
  dVar11 = scale * (double)(*size).wd.m_i;
  dVar12 = scale * (double)(*size).ht.m_i;
  auVar8._0_8_ = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
  auVar8._8_8_ = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
  auVar9 = maxpd(auVar8,_DAT_006747a0);
  iVar7 = (int)(double)(~-(ulong)(2147483647.0 < auVar8._0_8_) & auVar9._0_8_ |
                       -(ulong)(2147483647.0 < auVar8._0_8_) & 0x41dfffffffc00000);
  iVar10 = (int)(double)(~-(ulong)(2147483647.0 < auVar8._8_8_) & auVar9._8_8_ |
                        -(ulong)(2147483647.0 < auVar8._8_8_) & 0x41dfffffffc00000);
  uVar6 = 0;
  local_b8.d.d = (Data *)CONCAT44(iVar10,iVar7);
  local_98 = QPixmap::size(this_00);
  local_78.a.a.a.a.a.a.m_size = (qsizetype)local_98;
  if ((local_98 != (QSize)0x0) &&
     (auVar9._0_4_ = -(uint)(iVar7 < local_98.wd.m_i.m_i),
     iVar7 = -(uint)(iVar10 < local_98.ht.m_i.m_i), auVar9._4_4_ = auVar9._0_4_,
     auVar9._8_4_ = iVar7, auVar9._12_4_ = iVar7, iVar7 = movmskpd(uVar6,auVar9), iVar7 != 0)) {
    local_98 = (QSize)QSize::scaled((QSize *)&local_78,(AspectRatioMode)&local_b8);
  }
  scaleFactor = QIconPrivate::pixmapDevicePixelRatio(scale,size,&local_98);
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QPlatformPixmap *)QPixmap::cacheKey(this_00);
  QGuiApplication::palette();
  local_78.a.a.a.b.val = QPalette::cacheKey((QPalette *)&local_90);
  local_78.a.a.a.a.a.a.m_size = 10;
  local_78.a.a.a.a.a.a.m_data = "$qt_theme_";
  local_78.a.a.a.a.b.val = (uchar)mode;
  local_78.a.a.b.val = local_98.wd.m_i;
  local_78.a.b.val = local_98.ht.m_i;
  local_78.b.val =
       (unsigned_short)
       (int)((double)((ulong)(scaleFactor * 1000.0) & 0x8000000000000000 | (ulong)DAT_00674780) +
            scaleFactor * 1000.0);
  local_78.a.a.a.a.a.b.val = (unsigned_long_long)pQVar3;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
  ::convertTo<QString>(&local_b8,&local_78);
  QPalette::~QPalette((QPalette *)&local_90);
  (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap(__return_storage_ptr__);
  bVar2 = QPixmapCache::find(&local_b8,__return_storage_ptr__);
  if (!bVar2) {
    QVar4 = QPixmap::size(this_00);
    if ((local_98.wd.m_i == QVar4.wd.m_i.m_i) && (local_98.ht.m_i == QVar4.ht.m_i.m_i)) {
      QPixmap::operator=(__return_storage_ptr__,this_00);
    }
    else {
      QPixmap::scaled(&local_90,this_00,&local_98,IgnoreAspectRatio,SmoothTransformation);
      local_78.a.a.a.a.a.b.val = (unsigned_long_long)&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a.a.a.a.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a.a.a.a.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)&local_78);
      QVar1.d.ptr = local_90.data.d.ptr;
      local_78.a.a.a.a.a.a.m_size = (qsizetype)&PTR__QPixmap_007d25a8;
      local_90.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      local_78.a.a.a.a.a.b.val = (unsigned_long_long)(__return_storage_ptr__->data).d.ptr;
      (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)QVar1.d.ptr;
      QPixmap::~QPixmap((QPixmap *)&local_78);
      QPixmap::~QPixmap(&local_90);
    }
    lVar5 = QMetaObject::cast((QObject *)&QGuiApplication::staticMetaObject);
    if (lVar5 != 0) {
      (**(code **)(**(long **)(lVar5 + 8) + 0x70))
                (&local_90,*(long **)(lVar5 + 8),mode,__return_storage_ptr__);
      local_78.a.a.a.a.a.b.val = (unsigned_long_long)&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a.a.a.a.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a.a.a.a.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)&local_78);
      QVar1.d.ptr = local_90.data.d.ptr;
      local_78.a.a.a.a.a.a.m_size = (qsizetype)&PTR__QPixmap_007d25a8;
      local_90.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      local_78.a.a.a.a.a.b.val = (unsigned_long_long)(__return_storage_ptr__->data).d.ptr;
      (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)QVar1.d.ptr;
      QPixmap::~QPixmap((QPixmap *)&local_78);
      QPixmap::~QPixmap(&local_90);
    }
    QPixmap::setDevicePixelRatio(__return_storage_ptr__,scaleFactor);
    QPixmapCache::insert(&local_b8,__return_storage_ptr__);
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap PixmapEntry::pixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    Q_UNUSED(state);

    // Ensure that basePixmap is lazily initialized before generating the
    // key, otherwise the cache key is not unique
    if (basePixmap.isNull())
        basePixmap.load(filename);

    // If the size of the best match we have (basePixmap) is larger than the
    // requested size, we downscale it to match.
    const auto actualSize = QPixmapIconEngine::adjustSize(size * scale, basePixmap.size());
    const auto calculatedDpr = QIconPrivate::pixmapDevicePixelRatio(scale, size, actualSize);
    QString key = "$qt_theme_"_L1
                  % HexString<quint64>(basePixmap.cacheKey())
                  % HexString<quint8>(mode)
                  % HexString<quint64>(QGuiApplication::palette().cacheKey())
                  % HexString<uint>(actualSize.width())
                  % HexString<uint>(actualSize.height())
                  % HexString<quint16>(qRound(calculatedDpr * 1000));

    QPixmap cachedPixmap;
    if (QPixmapCache::find(key, &cachedPixmap)) {
        return cachedPixmap;
    } else {
        if (basePixmap.size() != actualSize)
            cachedPixmap = basePixmap.scaled(actualSize, Qt::IgnoreAspectRatio, Qt::SmoothTransformation);
        else
            cachedPixmap = basePixmap;
        if (QGuiApplication *guiApp = qobject_cast<QGuiApplication *>(qApp))
            cachedPixmap = static_cast<QGuiApplicationPrivate*>(QObjectPrivate::get(guiApp))->applyQIconStyleHelper(mode, cachedPixmap);
        cachedPixmap.setDevicePixelRatio(calculatedDpr);
        QPixmapCache::insert(key, cachedPixmap);
    }
    return cachedPixmap;
}